

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_d5c8::
ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTIteratorTest_singleLeafIteratorOneValue_Test<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  key_view akey;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  iterator b;
  TypeParam *db;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  string local_7d0;
  AssertHelper local_7b0;
  Message local_7a8;
  bool local_799;
  AssertionResult local_798;
  string local_788;
  bool in_stack_fffffffffffff89f;
  Message in_stack_fffffffffffff8a0;
  undefined1 local_750 [23];
  bool local_739;
  AssertionResult local_738;
  AssertHelper local_728;
  Message local_720;
  int local_714;
  key_view local_710;
  _Map_pointer local_700;
  AssertionResult local_6f8;
  string local_6e8;
  AssertHelper local_6c8;
  Message local_6c0;
  bool local_6b1;
  AssertionResult local_6b0;
  iterator local_6a0;
  pointer local_520;
  size_t sStack_518;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_508;
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)in_stack_fffffffffffff8a0.ss_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,in_stack_fffffffffffff89f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::test_only_iterator(&local_6a0,local_508);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::first(&local_6a0);
  local_6b1 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6a0);
  testing::AssertionResult::AssertionResult<bool>(&local_6b0,&local_6b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6b0);
  if (!bVar1) {
    testing::Message::Message(&local_6c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_6e8,(internal *)&local_6b0,(AssertionResult *)"b.valid()","false","true",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_6e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6c8,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper(&local_6c8);
    std::__cxx11::string::~string((string *)&local_6e8);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult(&local_6b0);
  local_710 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::get_key(&local_6a0);
  akey._M_extent = local_710._M_extent._M_extent_value;
  akey._M_ptr = (pointer)akey._M_extent._M_extent_value;
  local_700 = (_Map_pointer)decode((anon_unknown_dwarf_d5c8 *)local_710._M_ptr,akey);
  local_714 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_6f8,"(decode(b.get_key()))","(0)",(unsigned_long *)&local_700,
             &local_714);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar3 = testing::AssertionResult::failure_message(&local_6f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x49,pcVar3);
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult(&local_6f8);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::get_val((iterator *)local_750);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_739 = std::ranges::__equal_fn::
              operator()<unodb::qsbr_ptr_span<const_std::byte>,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                        ((__equal_fn *)&std::ranges::equal,(iterator *)local_750,pvVar2);
  testing::AssertionResult::AssertionResult<bool>(&local_738,&local_739,(type *)0x0);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span((qsbr_ptr_span<const_std::byte> *)local_750)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_738);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffff8a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_788,(internal *)&local_738,
               (AssertionResult *)"std::ranges::equal(b.get_val(), unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_788);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffff898,(Message *)&stack0xfffffffffffff8a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff898);
    std::__cxx11::string::~string((string *)&local_788);
    testing::Message::~Message((Message *)&stack0xfffffffffffff8a0);
  }
  testing::AssertionResult::~AssertionResult(&local_738);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::next(&local_6a0);
  local_799 = unodb::
              olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              ::iterator::valid(&local_6a0);
  local_799 = !local_799;
  testing::AssertionResult::AssertionResult<bool>(&local_798,&local_799,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_798);
  if (!bVar1) {
    testing::Message::Message(&local_7a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7d0,(internal *)&local_798,(AssertionResult *)"b.valid()","true","false",in_R9
              );
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_7d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_iter.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7b0,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper(&local_7b0);
    std::__cxx11::string::~string((string *)&local_7d0);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult(&local_798);
  unodb::
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  ::iterator::~iterator(&local_6a0);
  unodb::test::
  tree_verifier<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, singleLeafIteratorOneValue) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  auto b = db.test_only_iterator();
  b.first();  // obtain iterator.
  UNODB_EXPECT_TRUE(b.valid());
  UNODB_EXPECT_EQ(decode(b.get_key()), 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(b.get_val(), unodb::test::test_values[0]));
  b.next();                       // advance.
  UNODB_EXPECT_FALSE(b.valid());  // nothing more in the iterator.
}